

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O1

string * __thiscall
libtorrent::aux::tracker_list::last_working_url_abi_cxx11_
          (string *__return_storage_ptr__,tracker_list *this)

{
  announce_entry *paVar1;
  pointer pcVar2;
  
  paVar1 = this->m_last_working_tracker;
  if (paVar1 == (announce_entry *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (paVar1->url)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (paVar1->url)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string tracker_list::last_working_url() const
{
	if (m_last_working_tracker == nullptr) return {};
	return m_last_working_tracker->url;
}